

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_property.c
# Opt level: O1

int mpt_line_set(mpt_line *li,char *name,mpt_convertable *src)

{
  int iVar1;
  int iVar2;
  mpt_lineattr *pmVar3;
  mpt_fpoint *val;
  
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      iVar1 = -4;
    }
    else {
      iVar1 = mpt_line_typeid::ptype;
      if ((mpt_line_typeid::ptype == 0) &&
         (iVar1 = mpt_type_add(&mpt_line_typeid::traits), 0 < iVar1)) {
        mpt_line_typeid::ptype = iVar1;
      }
      if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)iVar1,li), -1 < iVar1)) {
        if (iVar1 != 0) {
          return 0;
        }
        (li->color).alpha = 0xff;
        (li->color).red = '\0';
        (li->color).green = '\0';
        (li->color).blue = '\0';
        (li->attr).style = '\x01';
        (li->attr).width = '\x01';
        (li->attr).symbol = '\0';
        (li->attr).size = '\n';
        (li->from).x = 0.0;
        (li->from).y = 0.0;
        (li->to).x = 0.0;
        (li->to).y = 0.0;
        return 0;
      }
      iVar1 = mpt_color_typeid();
      if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)iVar1,li), -1 < iVar1)) {
        if (iVar1 != 0) {
          return 0;
        }
        (li->color).alpha = 0xff;
        (li->color).red = '\0';
        (li->color).green = '\0';
        (li->color).blue = '\0';
        return 0;
      }
      iVar2 = mpt_lattr_typeid();
      iVar1 = -3;
      if (0 < iVar2) {
        pmVar3 = &li->attr;
        iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,pmVar3);
        if ((-1 < iVar2) && (iVar1 = 0, iVar2 == 0)) {
          pmVar3->style = '\x01';
          pmVar3->width = '\x01';
          pmVar3->symbol = '\0';
          pmVar3->size = '\n';
        }
      }
    }
  }
  else {
    if (*name != '\0') {
      iVar1 = strcmp(name,"x1");
      if (iVar1 == 0) {
        val = &li->from;
      }
      else {
        iVar1 = strcmp(name,"x2");
        if (iVar1 == 0) {
          val = &li->to;
        }
        else {
          iVar1 = strcmp(name,"y1");
          if (iVar1 == 0) {
            val = (mpt_fpoint *)&(li->from).y;
          }
          else {
            iVar1 = strcmp(name,"y2");
            if (iVar1 != 0) {
              iVar1 = strcasecmp(name,"color");
              if (iVar1 == 0) {
                iVar1 = mpt_color_pset(&li->color,src);
                return iVar1;
              }
              iVar1 = strcasecmp(name,"width");
              if (iVar1 == 0) {
                iVar1 = mpt_lattr_width(&li->attr,src);
                return iVar1;
              }
              iVar1 = strcasecmp(name,"style");
              if (iVar1 == 0) {
                iVar1 = mpt_lattr_style(&li->attr,src);
                return iVar1;
              }
              iVar1 = strcasecmp(name,"symbol");
              if (iVar1 != 0) {
                iVar1 = strcasecmp(name,"size");
                if (iVar1 != 0) {
                  return -1;
                }
                iVar1 = mpt_lattr_size(&li->attr,src);
                return iVar1;
              }
              iVar1 = mpt_lattr_symbol(&li->attr,src);
              return iVar1;
            }
            val = (mpt_fpoint *)&(li->to).y;
          }
        }
      }
      iVar1 = setPosition(&val->x,src);
      return iVar1;
    }
    if (src == (mpt_convertable *)0x0) {
      (li->color).alpha = 0xff;
      (li->color).red = '\0';
      (li->color).green = '\0';
      (li->color).blue = '\0';
      (li->attr).style = '\x01';
      (li->attr).width = '\x01';
      (li->attr).symbol = '\0';
      (li->attr).size = '\n';
      (li->from).x = 0.0;
      (li->from).y = 0.0;
      (li->to).x = 0.0;
      (li->to).y = 0.0;
      iVar1 = 0;
    }
    else {
      iVar1 = mpt_color_typeid();
      if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)iVar1,li), 0 < iVar1)) {
        return 0;
      }
      iVar1 = -3;
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_line_set(MPT_STRUCT(line) *li, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_line_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, li)) >= 0) {
			if (!len) *li = def_line;
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &li->color)) >= 0) {
			if (!len) li->color = def_line.color;
			return 0;
		}
		if ((type = mpt_lattr_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &li->attr)) >= 0) {
			if (!len) li->attr = def_line.attr;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		int type;
		if (!src) {
			*li = def_line;
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, li)) > 0) {
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcmp(name, "x1")) {
		return setPosition(&li->from.x, src);
	}
	if (!strcmp(name, "x2")) {
		return setPosition(&li->to.x, src);
	}
	if (!strcmp(name, "y1")) {
		return setPosition(&li->from.y, src);
	}
	if (!strcmp(name, "y2")) {
		return setPosition(&li->to.y, src);
	}
	if (!strcasecmp(name, "color")) {
		return mpt_color_pset(&li->color, src);
	}
	if (!strcasecmp(name, "width")) {
		return mpt_lattr_width(&li->attr, src);
	}
	if (!strcasecmp(name, "style")) {
		return mpt_lattr_style(&li->attr, src);
	}
	if (!strcasecmp(name, "symbol")) {
		return mpt_lattr_symbol(&li->attr, src);
	}
	if (!strcasecmp(name, "size")) {
		return mpt_lattr_size(&li->attr, src);
	}
	return MPT_ERROR(BadArgument);
}